

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O3

void __thiscall CTcLibParser::scan_var(CTcLibParser *this,char *name,char *val)

{
  int iVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  iVar1 = stricmp(name,"name");
  if (iVar1 == 0) {
    UNRECOVERED_JUMPTABLE = this->_vptr_CTcLibParser[0xc];
  }
  else {
    iVar1 = stricmp(name,"source");
    if (iVar1 == 0) {
      UNRECOVERED_JUMPTABLE = this->_vptr_CTcLibParser[0x11];
    }
    else {
      iVar1 = stricmp(name,"library");
      if (iVar1 == 0) {
        UNRECOVERED_JUMPTABLE = this->_vptr_CTcLibParser[0x12];
      }
      else {
        iVar1 = stricmp(name,"resource");
        if (iVar1 == 0) {
          UNRECOVERED_JUMPTABLE = this->_vptr_CTcLibParser[0x13];
        }
        else {
          iVar1 = stricmp(name,"needmacro");
          if (iVar1 != 0) {
            (*this->_vptr_CTcLibParser[6])(this,name,val);
            return;
          }
          UNRECOVERED_JUMPTABLE = this->_vptr_CTcLibParser[0x14];
        }
      }
    }
  }
  (*UNRECOVERED_JUMPTABLE)(this,val);
  return;
}

Assistant:

void CTcLibParser::scan_var(const char *name, const char *val)
{
    /* call the appropriate routine based on the variable name */
    if (stricmp(name, "name") == 0)
        scan_name(val);
    else if (stricmp(name, "source") == 0)
        scan_source(val);
    else if (stricmp(name, "library") == 0)
        scan_library(val);
    else if (stricmp(name, "resource") == 0)
        scan_resource(val);
    else if (stricmp(name, "needmacro") == 0)
        scan_needmacro(val);
    else
        err_unknown_var(name, val);
}